

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O3

adt_str_t * adt_str_clone(adt_str_t *other)

{
  adt_error_t aVar1;
  adt_str_t *self;
  
  if ((other != (adt_str_t *)0x0) && (self = (adt_str_t *)malloc(0x18), self != (adt_str_t *)0x0)) {
    self->s32Cur = 0;
    self->s32Size = 0;
    self->pAlloc = (uint8_t *)0x0;
    self->lastError = '\0';
    self->encoding = '\x01';
    aVar1 = adt_str_set(self,other);
    if (aVar1 == '\0') {
      return self;
    }
    adt_str_delete(self);
  }
  return (adt_str_t *)0x0;
}

Assistant:

adt_str_t *adt_str_clone(const adt_str_t* other)
{
   adt_str_t *self = (adt_str_t*) 0;
   if (other != 0)
   {
      self = adt_str_new();
      if (self != 0)
      {
         adt_error_t result = adt_str_set(self, other);
         if (result != ADT_NO_ERROR)
         {
            adt_str_delete(self);
            self = (adt_str_t*) 0;
         }
      }
   }
   return self;
}